

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_huffman_decode_char(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  cram_huffman_code *pcVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  cram_huffman_code *pcVar12;
  
  iVar1 = *out_size;
  if ((long)iVar1 < 1) {
    return 0;
  }
  iVar2 = (c->field_6).huffman.ncodes;
  pcVar4 = (c->field_6).huffman.codes;
  lVar8 = 0;
  do {
    uVar10 = pcVar4->len;
    if ((int)uVar10 < 1) {
      return -1;
    }
    sVar11 = in->byte;
    uVar6 = in->bit;
    iVar9 = 0;
    pcVar12 = pcVar4;
    uVar7 = uVar10;
    while( true ) {
      if ((long)(int)uVar6 + (in->alloc - sVar11) * 8 + 7 < (ulong)uVar10) {
        return -1;
      }
      do {
        iVar9 = (uint)((in->data[sVar11] >> (uVar6 & 0x1f) & 1) != 0) + iVar9 * 2;
        sVar11 = ((int)uVar6 < 1) + sVar11;
        in->byte = sVar11;
        uVar6 = uVar6 - 1 & 7;
        in->bit = uVar6;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      uVar10 = iVar9 - pcVar12->p;
      if (iVar2 <= (int)uVar10) {
        return -1;
      }
      if ((int)uVar10 < 0) {
        return -1;
      }
      pcVar12 = pcVar4 + uVar10;
      uVar3 = pcVar4[uVar10].len;
      if (uVar3 == uVar7 && pcVar4[uVar10].code == iVar9) break;
      uVar10 = uVar3 - uVar7;
      bVar5 = (int)uVar3 < (int)uVar7;
      uVar7 = uVar3;
      if (uVar10 == 0 || bVar5) {
        return -1;
      }
    }
    out[lVar8] = (char)pcVar12->symbol;
    lVar8 = lVar8 + 1;
    if (lVar8 == iVar1) {
      return 0;
    }
  } while( true );
}

Assistant:

int cram_huffman_decode_char(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int i, n, ncodes = c->huffman.ncodes;
    const cram_huffman_code * const codes = c->huffman.codes;

    for (i = 0, n = *out_size; i < n; i++) {
	int idx = 0;
	int val = 0, len = 0, last_len = 0;

	for (;;) {
	    int dlen = codes[idx].len - last_len;
	    if (dlen <= 0 || (in->alloc - in->byte)*8 + in->bit + 7 < dlen)
		return -1;

	    //val <<= dlen;
	    //val  |= get_bits_MSB(in, dlen);
	    //last_len = (len += dlen);

	    last_len = (len += dlen);
	    for (; dlen; dlen--) GET_BIT_MSB(in, val);

	    idx = val - codes[idx].p;
	    if (idx >= ncodes || idx < 0)
		return -1;

	    if (codes[idx].code == val && codes[idx].len == len) {
		out[i] = codes[idx].symbol;
		break;
	    }
	}
    }

    return 0;
}